

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int session_handle_invalid_connection
              (nghttp2_session *session,nghttp2_frame *frame,int lib_error_code,char *reason)

{
  int iVar1;
  uint32_t error_code;
  char *reason_local;
  int lib_error_code_local;
  nghttp2_frame *frame_local;
  nghttp2_session *session_local;
  
  if (((session->callbacks).on_invalid_frame_recv_callback ==
       (nghttp2_on_invalid_frame_recv_callback)0x0) ||
     (iVar1 = (*(session->callbacks).on_invalid_frame_recv_callback)
                        (session,frame,lib_error_code,session->user_data), iVar1 == 0)) {
    error_code = get_error_code_from_lib_error_code(lib_error_code);
    session_local._4_4_ = nghttp2_session_terminate_session_with_reason(session,error_code,reason);
  }
  else {
    session_local._4_4_ = -0x386;
  }
  return session_local._4_4_;
}

Assistant:

static int session_handle_invalid_connection(nghttp2_session *session,
                                             nghttp2_frame *frame,
                                             int lib_error_code,
                                             const char *reason) {
  if (session->callbacks.on_invalid_frame_recv_callback) {
    if (session->callbacks.on_invalid_frame_recv_callback(
            session, frame, lib_error_code, session->user_data) != 0) {
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    }
  }
  return nghttp2_session_terminate_session_with_reason(
      session, get_error_code_from_lib_error_code(lib_error_code), reason);
}